

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_closed_set_normalizer.cc
# Opt level: O3

void __thiscall
s2builderutil::NormalizeClosedSetImpl::Build
          (NormalizeClosedSetImpl *this,int dimension,Graph *g,S2Error *error)

{
  int iVar1;
  pointer pGVar2;
  __uniq_ptr_data<S2Builder::Layer,_std::default_delete<S2Builder::Layer>,_true,_true> _Var3;
  DegenerateEdges DVar4;
  vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_> *__x;
  long lVar5;
  Graph *pGVar6;
  pointer pGVar7;
  int dim;
  long lVar8;
  vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_> output;
  vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_> local_38;
  
  pGVar2 = (this->graphs_).super__Vector_base<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pGVar6 = g;
  pGVar7 = pGVar2 + dimension;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    DVar4 = (pGVar6->options_).degenerate_edges_;
    (pGVar7->options_).edge_type_ = (pGVar6->options_).edge_type_;
    (pGVar7->options_).degenerate_edges_ = DVar4;
    pGVar6 = (Graph *)&(pGVar6->options_).duplicate_edges_;
    pGVar7 = (pointer)&(pGVar7->options_).duplicate_edges_;
  }
  std::function<bool_(const_S2Builder::Graph_&,_S2Error_*)>::operator=
            (&pGVar2[dimension].is_full_polygon_predicate_,&g->is_full_polygon_predicate_);
  iVar1 = this->graphs_left_;
  this->graphs_left_ = iVar1 + -1;
  if (iVar1 < 2) {
    __x = ClosedSetNormalizer::Run(&this->normalizer_,&this->graphs_,error);
    std::vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>::vector(&local_38,__x);
    lVar8 = 0;
    lVar5 = 0;
    do {
      _Var3.super___uniq_ptr_impl<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>._M_t.
      super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>.
      super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl =
           (this->output_layers_).
           super__Vector_base<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar5]._M_t.
           super___uniq_ptr_impl<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>;
      (**(code **)(*(long *)_Var3.
                            super___uniq_ptr_impl<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>
                            .super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl + 0x18))
                (_Var3.
                 super___uniq_ptr_impl<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>.
                 super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl,
                 (long)&((local_38.
                          super__Vector_base<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>.
                          _M_impl.super__Vector_impl_data._M_start)->options_).edge_type_ + lVar8,
                 error);
      lVar5 = lVar5 + 1;
      lVar8 = lVar8 + 0x68;
    } while (lVar5 != 3);
    std::vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>::~vector(&local_38);
  }
  return;
}

Assistant:

void Build(int dimension, const Graph& g, S2Error* error) {
    // Errors are reported only on the last layer built.
    graphs_[dimension] = g;
    if (--graphs_left_ > 0) return;

    vector<Graph> output = normalizer_.Run(graphs_, error);
    for (int dim = 0; dim < 3; ++dim) {
      output_layers_[dim]->Build(output[dim], error);
    }
  }